

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FZFile.cpp
# Opt level: O1

void __thiscall FZFile::gen_outline(FZFile *this)

{
  pointer pBVar1;
  pointer pBVar2;
  pointer pBVar3;
  vector<BRDPoint,_std::allocator<BRDPoint>_> *this_00;
  int iVar4;
  pointer pBVar5;
  pointer pBVar6;
  pointer pBVar7;
  pointer pBVar8;
  pointer pBVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  bool bVar13;
  bool bVar14;
  BRDPoint local_38;
  
  pBVar3 = (this->super_BRDFileBase).pins.super__Vector_base<BRDPin,_std::allocator<BRDPin>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pBVar1 = (this->super_BRDFileBase).pins.super__Vector_base<BRDPin,_std::allocator<BRDPin>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  bVar13 = pBVar3 != pBVar1;
  pBVar2 = pBVar3 + 1;
  bVar14 = pBVar2 != pBVar1;
  pBVar5 = pBVar3;
  pBVar6 = pBVar2;
  pBVar7 = pBVar3;
  if (bVar14 && bVar13) {
    do {
      pBVar5 = pBVar6;
      if ((pBVar7->pos).x <= (pBVar6->pos).x) {
        pBVar5 = pBVar7;
      }
      pBVar6 = pBVar6 + 1;
      pBVar7 = pBVar5;
    } while (pBVar6 != pBVar1);
  }
  pBVar6 = pBVar3;
  pBVar7 = pBVar2;
  pBVar8 = pBVar3;
  if (bVar14 && bVar13) {
    do {
      pBVar6 = pBVar7;
      if ((pBVar7->pos).x <= (pBVar8->pos).x) {
        pBVar6 = pBVar8;
      }
      pBVar7 = pBVar7 + 1;
      pBVar8 = pBVar6;
    } while (pBVar7 != pBVar1);
  }
  pBVar7 = pBVar2;
  pBVar8 = pBVar3;
  pBVar9 = pBVar3;
  if (bVar14 && bVar13) {
    do {
      pBVar8 = pBVar7;
      if ((pBVar9->pos).y <= (pBVar7->pos).y) {
        pBVar8 = pBVar9;
      }
      pBVar7 = pBVar7 + 1;
      pBVar9 = pBVar8;
    } while (pBVar7 != pBVar1);
  }
  if (bVar14 && bVar13) {
    do {
      pBVar7 = pBVar2;
      if ((pBVar2->pos).y <= (pBVar3->pos).y) {
        pBVar7 = pBVar3;
      }
      pBVar3 = pBVar7;
      pBVar2 = pBVar2 + 1;
    } while (pBVar2 != pBVar1);
  }
  iVar12 = (pBVar8->pos).y + -0x14;
  iVar10 = (pBVar6->pos).x + 0x14;
  iVar4 = (pBVar5->pos).x + -0x14;
  iVar11 = (pBVar3->pos).y + 0x14;
  this_00 = &(this->super_BRDFileBase).format;
  local_38.y = iVar12;
  local_38.x = iVar4;
  std::vector<BRDPoint,_std::allocator<BRDPoint>_>::emplace_back<BRDPoint>(this_00,&local_38);
  local_38.x = iVar10;
  std::vector<BRDPoint,_std::allocator<BRDPoint>_>::emplace_back<BRDPoint>(this_00,&local_38);
  local_38.y = iVar11;
  std::vector<BRDPoint,_std::allocator<BRDPoint>_>::emplace_back<BRDPoint>(this_00,&local_38);
  local_38.x = iVar4;
  std::vector<BRDPoint,_std::allocator<BRDPoint>_>::emplace_back<BRDPoint>(this_00,&local_38);
  local_38.y = iVar12;
  std::vector<BRDPoint,_std::allocator<BRDPoint>_>::emplace_back<BRDPoint>(this_00,&local_38);
  return;
}

Assistant:

void FZFile::gen_outline() {
	// Determine board outline
	int minx =
	    std::min_element(pins.begin(), pins.end(), [](BRDPin a, BRDPin b) { return a.pos.x < b.pos.x; })->pos.x - OUTLINE_MARGIN;
	int maxx =
	    std::max_element(pins.begin(), pins.end(), [](BRDPin a, BRDPin b) { return a.pos.x < b.pos.x; })->pos.x + OUTLINE_MARGIN;
	int miny =
	    std::min_element(pins.begin(), pins.end(), [](BRDPin a, BRDPin b) { return a.pos.y < b.pos.y; })->pos.y - OUTLINE_MARGIN;
	int maxy =
	    std::max_element(pins.begin(), pins.end(), [](BRDPin a, BRDPin b) { return a.pos.y < b.pos.y; })->pos.y + OUTLINE_MARGIN;
	format.push_back({minx, miny});
	format.push_back({maxx, miny});
	format.push_back({maxx, maxy});
	format.push_back({minx, maxy});
	format.push_back({minx, miny});
}